

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

char * __thiscall
CoreML::Specification::ArrayFeatureType::_InternalParse
          (ArrayFeatureType *this,char *ptr,ParseContext *ctx)

{
  int32_t iVar1;
  DefaultOptionalValueUnion DVar2;
  uint tag_00;
  bool bVar3;
  uint32_t uVar4;
  ArrayFeatureType_EnumeratedShapes *msg;
  uint64_t uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint uVar6;
  char cVar7;
  uint32_t tag;
  DefaultOptionalValueUnion *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_MessageLite)._internal_metadata_;
  local_48 = (DefaultOptionalValueUnion *)ptr;
LAB_0019df6c:
  do {
    bVar3 = google::protobuf::internal::ParseContext::Done(ctx,(char **)&local_48);
    if (bVar3) {
      return (char *)local_48;
    }
    local_48 = (DefaultOptionalValueUnion *)
               google::protobuf::internal::ReadTag((char *)&local_48->intdefaultvalue_,&local_3c,0);
    tag_00 = local_3c;
    uVar6 = local_3c >> 3;
    cVar7 = (char)local_3c;
    if (uVar6 == 0x3d) {
      if (cVar7 == -0x17) {
        DVar2 = *local_48;
        if (this->_oneof_case_[1] != 0x3d) {
          this->_oneof_case_[1] = 0x3d;
        }
        this->defaultOptionalValue_ = DVar2;
        local_48 = local_48 + 1;
        goto LAB_0019df6c;
      }
LAB_0019e0f6:
      if ((local_3c == 0) || ((local_3c & 7) == 4)) {
        if (local_48 == (DefaultOptionalValueUnion *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
        return (char *)local_48;
      }
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields<std::__cxx11::string>(local_38);
      local_48 = (DefaultOptionalValueUnion *)
                 google::protobuf::internal::UnknownFieldParse
                           (tag_00,unknown,(char *)&local_48->intdefaultvalue_,ctx);
    }
    else {
      if (uVar6 == 2) {
        if (cVar7 != '\x10') goto LAB_0019e0f6;
        uVar5 = google::protobuf::internal::ReadVarint64((char **)&local_48);
        if (local_48 == (DefaultOptionalValueUnion *)0x0) {
          return (char *)0x0;
        }
        this->datatype_ = (int)uVar5;
        goto LAB_0019df6c;
      }
      if (uVar6 == 0x15) {
        if (cVar7 == -0x56) {
          msg = _internal_mutable_enumeratedshapes(this);
LAB_0019e0a6:
          local_48 = (DefaultOptionalValueUnion *)
                     google::protobuf::internal::ParseContext::ParseMessage
                               (ctx,&msg->super_MessageLite,(char *)&local_48->intdefaultvalue_);
          goto joined_r0x0019e05d;
        }
        goto LAB_0019e0f6;
      }
      if (uVar6 == 0x1f) {
        if (cVar7 == -6) {
          msg = (ArrayFeatureType_EnumeratedShapes *)_internal_mutable_shaperange(this);
          goto LAB_0019e0a6;
        }
        goto LAB_0019e0f6;
      }
      if (uVar6 == 0x29) {
        if (cVar7 == 'H') {
          uVar4 = google::protobuf::internal::ReadVarint32((char **)&local_48);
          if (this->_oneof_case_[1] != 0x29) {
            this->_oneof_case_[1] = 0x29;
          }
          (this->defaultOptionalValue_).intdefaultvalue_ = uVar4;
          goto joined_r0x0019e05d;
        }
        goto LAB_0019e0f6;
      }
      if (uVar6 == 0x33) {
        if (cVar7 != -99) goto LAB_0019e0f6;
        iVar1 = local_48->intdefaultvalue_;
        if (this->_oneof_case_[1] != 0x33) {
          this->_oneof_case_[1] = 0x33;
        }
        (this->defaultOptionalValue_).intdefaultvalue_ = iVar1;
        local_48 = (DefaultOptionalValueUnion *)((long)local_48 + 4);
        goto LAB_0019df6c;
      }
      if (uVar6 != 1) goto LAB_0019e0f6;
      if (cVar7 == '\n') {
        local_48 = (DefaultOptionalValueUnion *)
                   google::protobuf::internal::PackedInt64Parser
                             (&this->shape_,(char *)&local_48->intdefaultvalue_,ctx);
      }
      else {
        if ((local_3c & 0xff) != 8) goto LAB_0019e0f6;
        uVar5 = google::protobuf::internal::ReadVarint64((char **)&local_48);
        _internal_add_shape(this,uVar5);
      }
    }
joined_r0x0019e05d:
    if (local_48 == (DefaultOptionalValueUnion *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ArrayFeatureType::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated int64 shape = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedInt64Parser(_internal_mutable_shape(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 8) {
          _internal_add_shape(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_datatype(static_cast<::CoreML::Specification::ArrayFeatureType_ArrayDataType>(val));
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
      case 21:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 170)) {
          ptr = ctx->ParseMessage(_internal_mutable_enumeratedshapes(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
      case 31:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 250)) {
          ptr = ctx->ParseMessage(_internal_mutable_shaperange(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int32 intDefaultValue = 41;
      case 41:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 72)) {
          _internal_set_intdefaultvalue(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // float floatDefaultValue = 51;
      case 51:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 157)) {
          _internal_set_floatdefaultvalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr));
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // double doubleDefaultValue = 61;
      case 61:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 233)) {
          _internal_set_doubledefaultvalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}